

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void outerproduct(float32 **a,float32 *x,float32 *y,int32 len)

{
  float32 *pfVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (0 < len) {
    uVar2 = (ulong)(uint)len;
    uVar3 = 0;
    do {
      pfVar1 = a[uVar3];
      pfVar1[uVar3] = (float32)((float)x[uVar3] * (float)y[uVar3]);
      uVar4 = uVar3 + 1;
      uVar5 = uVar3;
      if (uVar4 < uVar2) {
        do {
          pfVar1[uVar5 + 1] = (float32)((float)x[uVar3] * (float)y[uVar5 + 1]);
          a[uVar5 + 1][uVar3] = (float32)((float)x[uVar5 + 1] * (float)y[uVar3]);
          uVar5 = uVar5 + 1;
        } while (uVar2 - 1 != uVar5);
      }
      uVar3 = uVar4;
    } while (uVar4 != uVar2);
  }
  return;
}

Assistant:

void
outerproduct(float32 ** a, float32 * x, float32 * y, int32 len)
{
    int32 i, j;

    for (i = 0; i < len; ++i) {
        a[i][i] = x[i] * y[i];
        for (j = i + 1; j < len; ++j) {
            a[i][j] = x[i] * y[j];
            a[j][i] = x[j] * y[i];
        }
    }
}